

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestAllTypes>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:283:29),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:285:10)>
::getImpl(TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestAllTypes>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:283:29),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:285:10)>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::_::Void> *pEVar1;
  Response<capnproto_test::capnp::test::TestAllTypes> *in_00;
  Void local_571;
  ExceptionOr<kj::_::Void> local_570;
  Response<capnproto_test::capnp::test::TestAllTypes> *local_3d0;
  Response<capnproto_test::capnp::test::TestAllTypes> *depValue;
  Response<capnproto_test::capnp::test::TestAllTypes> *_depValue742;
  ExceptionOr<kj::_::Void> local_3b8;
  Exception *local_218;
  Exception *depException;
  Exception *_depException738;
  undefined1 local_1f8 [8];
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestAllTypes>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:283:29),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:285:10)>
  *this_local;
  
  depResult.value.ptr.field_1.value.hook.ptr = (ResponseHook *)output;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::ExceptionOr
            ((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)local_1f8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1f8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1f8);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<capnp::Response<capnproto_test::capnp::test::TestAllTypes>>
                         ((Maybe<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)
                          ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                  details.builder + 0x18));
    if (depValue != (Response<capnproto_test::capnp::test::TestAllTypes> *)0x0) {
      local_3d0 = depValue;
      in_00 = mv<capnp::Response<capnproto_test::capnp::test::TestAllTypes>>(depValue);
      MaybeVoidCaller<capnp::Response<capnproto_test::capnp::test::TestAllTypes>,kj::_::Void>::
      apply<capnp::_::(anonymous_namespace)::TestCase199::run()::__1>
                ((Type *)&this->field_0x20,in_00);
      TransformPromiseNodeBase::handle<kj::_::Void>
                (&local_570,&this->super_TransformPromiseNodeBase,&local_571);
      pEVar1 = ExceptionOrValue::as<kj::_::Void>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.hook.ptr);
      ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_570);
      ExceptionOr<kj::_::Void>::~ExceptionOr(&local_570);
    }
  }
  else {
    local_218 = depException;
    in = mv<kj::Exception>(depException);
    MaybeVoidCaller<kj::Exception,kj::_::Void>::
    apply<capnp::_::(anonymous_namespace)::TestCase199::run()::__4>((Type *)&this->field_0x21,in);
    TransformPromiseNodeBase::handle<kj::_::Void>
              (&local_3b8,&this->super_TransformPromiseNodeBase,(Void *)((long)&_depValue742 + 7));
    pEVar1 = ExceptionOrValue::as<kj::_::Void>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.hook.ptr);
    ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_3b8);
    ExceptionOr<kj::_::Void>::~ExceptionOr(&local_3b8);
  }
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::~ExceptionOr
            ((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)local_1f8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }